

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::
BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
::BinaryViewExpression
          (BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
           *this,ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                 *e1,
          ViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
          *e2)

{
  bool assertion;
  size_t sVar1;
  size_t sVar2;
  size_t j;
  ulong j_00;
  
  this->e1_ = (expression_type_1 *)e1;
  this->e2_ = (expression_type_2 *)e2;
  if (*(long *)(*(long *)(e1 + 8) + 0x30) == 0 && *(long *)(*(long *)e1 + 0x30) == 0) {
    assertion = false;
  }
  else {
    assertion = *(long *)(*(long *)(e2 + 8) + 0x30) != 0 || *(long *)(**(long **)e2 + 0x30) != 0;
  }
  marray_detail::Assert<bool>(assertion);
  sVar1 = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
          ::dimension(this->e1_);
  sVar2 = BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
          ::dimension(this->e2_);
  marray_detail::Assert<bool>(sVar1 == sVar2);
  j_00 = 0;
  while( true ) {
    sVar1 = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
            ::dimension(this->e1_);
    if (sVar1 <= j_00) break;
    sVar1 = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
            ::shape(this->e1_,j_00);
    sVar2 = BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
            ::shape(this->e2_,j_00);
    marray_detail::Assert<bool>(sVar1 == sVar2);
    j_00 = j_00 + 1;
  }
  return;
}

Assistant:

BinaryViewExpression(const ViewExpression<E1, T1>& e1, 
        const ViewExpression<E2, T2>& e2) 
        : e1_(e1), e2_(e2), // cast!
          binaryFunctor_(BinaryFunctor()) 
        {
            if(!MARRAY_NO_DEBUG) {
                marray_detail::Assert(e1_.size() != 0 && e2_.size() != 0);
                marray_detail::Assert(e1_.dimension() == e2_.dimension());
                for(std::size_t j=0; j<e1_.dimension(); ++j) {
                    marray_detail::Assert(e1_.shape(j) == e2_.shape(j));
                }
            }
        }